

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_error.hpp
# Opt level: O2

string * __thiscall
jsoncons::detail::conv_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,conv_error_category_impl *this,int ev)

{
  char *__s;
  allocator<char> local_9;
  
  switch(ev) {
  case 1:
    __s = "Unable to convert into the provided type";
    break;
  case 2:
    __s = "Cannot convert string to UTF-8";
    break;
  case 3:
    __s = "Cannot convert string to wide characters";
    break;
  case 4:
    __s = "Cannot convert to vector";
    break;
  case 5:
    __s = "Cannot convert to std::array";
    break;
  case 6:
    __s = "Cannot convert to map";
    break;
  case 7:
    __s = "Cannot convert to std::pair";
    break;
  case 8:
    __s = "Cannot convert to string";
    break;
  case 9:
    __s = "Cannot convert to string_view";
    break;
  case 10:
    __s = "Cannot convert to byte_string";
    break;
  case 0xb:
    __s = "Cannot convert to byte_string_view";
    break;
  case 0xc:
    __s = "Cannot convert to integer";
    break;
  case 0xd:
    __s = "Cannot convert to signed integer";
    break;
  case 0xe:
    __s = "Cannot convert to unsigned integer";
    break;
  case 0xf:
    __s = "Cannot convert to bigint";
    break;
  case 0x10:
    __s = "Cannot convert to double";
    break;
  case 0x11:
    __s = "Cannot convert to bool";
    break;
  case 0x12:
    __s = "Cannot convert to std::variant";
    break;
  case 0x13:
    __s = "Cannot convert to std::nullptr_t";
    break;
  case 0x14:
    __s = "Cannot convert to jsoncons::null_type";
    break;
  case 0x15:
    __s = "Cannot convert to std::bitset";
    break;
  case 0x16:
    __s = "Input is not a base64 encoded string";
    break;
  case 0x17:
    __s = "Input is not a base64url encoded string";
    break;
  case 0x18:
    __s = "Input is not a base16 encoded string";
    break;
  default:
    __s = "Unknown conversion error";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
        {
            switch (static_cast<conv_errc>(ev))
            {
                case conv_errc::conversion_failed:
                    return "Unable to convert into the provided type";
                case conv_errc::not_utf8:
                    return "Cannot convert string to UTF-8";
                case conv_errc::not_wide_char:
                    return "Cannot convert string to wide characters";
                case conv_errc::not_vector:
                    return "Cannot convert to vector";
                case conv_errc::not_array:
                    return "Cannot convert to std::array";
                case conv_errc::not_map:
                    return "Cannot convert to map";
                case conv_errc::not_pair:
                    return "Cannot convert to std::pair";
                case conv_errc::not_string:
                    return "Cannot convert to string";
                case conv_errc::not_string_view:
                    return "Cannot convert to string_view";
                case conv_errc::not_byte_string:
                    return "Cannot convert to byte_string";
                case conv_errc::not_byte_string_view:
                    return "Cannot convert to byte_string_view";
                case conv_errc::not_integer:
                    return "Cannot convert to integer";
                case conv_errc::not_signed_integer:
                    return "Cannot convert to signed integer";
                case conv_errc::not_unsigned_integer:
                    return "Cannot convert to unsigned integer";
                case conv_errc::not_bigint:
                    return "Cannot convert to bigint";
                case conv_errc::not_double:
                    return "Cannot convert to double";
                case conv_errc::not_bool:
                    return "Cannot convert to bool";
                case conv_errc::not_variant:
                    return "Cannot convert to std::variant";
                case conv_errc::not_nullptr:
                    return "Cannot convert to std::nullptr_t";
                case conv_errc::not_jsoncons_null_type:
                    return "Cannot convert to jsoncons::null_type";
                case conv_errc::not_bitset:
                    return "Cannot convert to std::bitset";
                case conv_errc::not_base64:
                    return "Input is not a base64 encoded string";
                case conv_errc::not_base64url:
                    return "Input is not a base64url encoded string";
                case conv_errc::not_base16:
                    return "Input is not a base16 encoded string";
                default:
                    return "Unknown conversion error";
            }
        }